

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::ComputeOutputDir(cmGeneratorTarget *this,string *config,bool implib,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  pointer pcVar3;
  size_type sVar4;
  cmGlobalGenerator *pcVar5;
  cmMakefile *pcVar6;
  Snapshot snapshot;
  Snapshot snapshot_00;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  cmGeneratorExpressionEvaluator **ppcVar11;
  long *plVar12;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string conf;
  string configPropStr;
  string propertyNameStr;
  string targetTypeName;
  string configUpper;
  cmGeneratorExpression local_1b0;
  cmCommandContext local_170;
  undefined1 local_148 [64];
  string local_108;
  cmGeneratorExpressionEvaluator **local_e8;
  long local_e0;
  cmGeneratorExpressionEvaluator *local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  _Base_ptr *local_a8;
  long local_a0;
  _Base_ptr local_98 [2];
  char *local_88;
  string local_80;
  Snapshot local_60;
  Snapshot local_48;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar3 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + config->_M_string_length);
  switch(this->Target->TargetTypeValue) {
  case EXECUTABLE:
    pcVar9 = "RUNTIME";
    goto LAB_0033ce18;
  case STATIC_LIBRARY:
    pcVar9 = "ARCHIVE";
    break;
  case SHARED_LIBRARY:
    pcVar10 = "RUNTIME";
    if (implib) {
      pcVar10 = "ARCHIVE";
    }
    pcVar9 = "LIBRARY";
    if (this->DLLPlatform != false) {
      pcVar9 = pcVar10;
    }
    break;
  case MODULE_LIBRARY:
    pcVar9 = "LIBRARY";
LAB_0033ce18:
    if (implib) {
      pcVar9 = "ARCHIVE";
    }
    break;
  default:
    pcVar9 = "";
  }
  std::__cxx11::string::string((string *)&local_a8,pcVar9,(allocator *)&local_1b0);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,local_a0 + (long)local_a8);
  if (local_c0 == 0) {
    plVar12 = (long *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_c8);
    plVar12 = local_c8;
  }
  cmsys::SystemTools::UpperCase(&local_80,&local_108);
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_a8,local_a0 + (long)local_a8);
  if (local_e0 == 0) {
    ppcVar11 = (cmGeneratorExpressionEvaluator **)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_e8);
    std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_80._M_dataplus._M_p);
    ppcVar11 = local_e8;
  }
  std::__cxx11::string::string((string *)&local_1b0,(char *)ppcVar11,(allocator *)local_148);
  pcVar9 = cmTarget::GetProperty(this->Target,(string *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.Backtrace.Context.Name._M_dataplus._M_p !=
      &local_1b0.Backtrace.Context.Name.field_2) {
    operator_delete(local_1b0.Backtrace.Context.Name._M_dataplus._M_p,
                    local_1b0.Backtrace.Context.Name.field_2._M_allocated_capacity + 1);
  }
  if (pcVar9 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_1b0,(char *)plVar12,(allocator *)local_148);
    pcVar9 = cmTarget::GetProperty(this->Target,(string *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.Backtrace.Context.Name._M_dataplus._M_p !=
        &local_1b0.Backtrace.Context.Name.field_2) {
      operator_delete(local_1b0.Backtrace.Context.Name._M_dataplus._M_p,
                      local_1b0.Backtrace.Context.Name.field_2._M_allocated_capacity + 1);
    }
    if (pcVar9 == (char *)0x0) {
      TVar2 = this->Target->TargetTypeValue;
      if (TVar2 - STATIC_LIBRARY < 3) {
        pcVar6 = this->Makefile;
        local_1b0.Backtrace.Context.Name._M_dataplus._M_p =
             (pointer)&local_1b0.Backtrace.Context.Name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"LIBRARY_OUTPUT_PATH","");
        pcVar10 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&local_1b0);
        pcVar9 = (char *)out->_M_string_length;
        strlen(pcVar10);
        std::__cxx11::string::_M_replace((ulong)out,0,pcVar9,(ulong)pcVar10);
      }
      else {
        if (TVar2 != EXECUTABLE) goto LAB_0033d0d8;
        pcVar6 = this->Makefile;
        local_1b0.Backtrace.Context.Name._M_dataplus._M_p =
             (pointer)&local_1b0.Backtrace.Context.Name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"EXECUTABLE_OUTPUT_PATH","");
        pcVar10 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&local_1b0);
        pcVar9 = (char *)out->_M_string_length;
        strlen(pcVar10);
        std::__cxx11::string::_M_replace((ulong)out,0,pcVar9,(ulong)pcVar10);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.Backtrace.Context.Name._M_dataplus._M_p !=
          &local_1b0.Backtrace.Context.Name.field_2) {
        operator_delete(local_1b0.Backtrace.Context.Name._M_dataplus._M_p,
                        local_1b0.Backtrace.Context.Name.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0033d0d8;
    }
    cmState::Snapshot::Snapshot(&local_60,(cmState *)0x0);
    paVar1 = &local_170.Name.field_2;
    local_170.Name._M_string_length = 0;
    local_170.Name.field_2._M_local_buf[0] = '\0';
    local_170.Line = 0;
    snapshot_00.Position.Tree = local_60.Position.Tree;
    snapshot_00.State = local_60.State;
    snapshot_00.Position.Position = local_60.Position.Position;
    local_170.Name._M_dataplus._M_p = (pointer)paVar1;
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)local_148,snapshot_00,&local_170);
    cmGeneratorExpression::cmGeneratorExpression(&local_1b0,(cmListFileBacktrace *)local_148);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_170.Name._M_dataplus._M_p,
                      CONCAT71(local_170.Name.field_2._M_allocated_capacity._1_7_,
                               local_170.Name.field_2._M_local_buf[0]) + 1);
    }
    local_88 = pcVar9;
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_148,(char *)&local_1b0);
    local_170.Name._M_dataplus._M_p = (pointer)local_148._0_8_;
    local_148._0_8_ = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_148);
    local_148._8_8_ = 0;
    local_148[0x10] = '\0';
    local_148._0_8_ = (cmCompiledGeneratorExpression *)(local_148 + 0x10);
    pcVar10 = cmCompiledGeneratorExpression::Evaluate
                        ((cmCompiledGeneratorExpression *)local_170.Name._M_dataplus._M_p,
                         this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                         (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                         (string *)local_148);
    pcVar9 = (char *)out->_M_string_length;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar9,(ulong)pcVar10);
    if ((cmCompiledGeneratorExpression *)local_148._0_8_ !=
        (cmCompiledGeneratorExpression *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
    }
    iVar8 = std::__cxx11::string::compare((char *)out);
    if (iVar8 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_108,0,(char *)local_108._M_string_length,0x50ea83);
    }
  }
  else {
    cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
    paVar1 = &local_170.Name.field_2;
    local_170.Name._M_string_length = 0;
    local_170.Name.field_2._M_local_buf[0] = '\0';
    local_170.Line = 0;
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    local_170.Name._M_dataplus._M_p = (pointer)paVar1;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_148,snapshot,&local_170);
    cmGeneratorExpression::cmGeneratorExpression(&local_1b0,(cmListFileBacktrace *)local_148);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_170.Name._M_dataplus._M_p,
                      CONCAT71(local_170.Name.field_2._M_allocated_capacity._1_7_,
                               local_170.Name.field_2._M_local_buf[0]) + 1);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_148,(char *)&local_1b0);
    local_170.Name._M_dataplus._M_p = (pointer)local_148._0_8_;
    local_148._0_8_ = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_148);
    local_148._8_8_ = 0;
    local_148[0x10] = '\0';
    local_148._0_8_ = (cmCompiledGeneratorExpression *)(local_148 + 0x10);
    pcVar10 = cmCompiledGeneratorExpression::Evaluate
                        ((cmCompiledGeneratorExpression *)local_170.Name._M_dataplus._M_p,
                         this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                         (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                         (string *)local_148);
    pcVar9 = (char *)out->_M_string_length;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar9,(ulong)pcVar10);
    if ((cmCompiledGeneratorExpression *)local_148._0_8_ !=
        (cmCompiledGeneratorExpression *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_108,0,(char *)local_108._M_string_length,0x50ea83);
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_170);
  cmGeneratorExpression::~cmGeneratorExpression(&local_1b0);
LAB_0033d0d8:
  sVar4 = out->_M_string_length;
  if (sVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)0x0,0x4c4af8);
  }
  pcVar9 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)&local_1b0,out,pcVar9);
  std::__cxx11::string::operator=((string *)out,(string *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.Backtrace.Context.Name._M_dataplus._M_p !=
      &local_1b0.Backtrace.Context.Name.field_2) {
    operator_delete(local_1b0.Backtrace.Context.Name._M_dataplus._M_p,
                    local_1b0.Backtrace.Context.Name.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_108._M_string_length != (char *)0x0) {
    bVar7 = cmMakefile::PlatformIsAppleIos(this->Makefile);
    pcVar9 = "";
    if (sVar4 == 0 && bVar7) {
      pcVar9 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    local_1b0.Backtrace.Context.Name._M_dataplus._M_p =
         (pointer)&local_1b0.Backtrace.Context.Name.field_2;
    pcVar10 = pcVar9 + 0x1a;
    if (sVar4 != 0 || !bVar7) {
      pcVar10 = pcVar9;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,pcVar9,pcVar10);
    pcVar5 = this->LocalGenerator->GlobalGenerator;
    local_148._0_8_ = (cmCompiledGeneratorExpression *)(local_148 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"/","");
    (*pcVar5->_vptr_cmGlobalGenerator[0x10])(pcVar5,local_148,&local_108,&local_1b0,out);
    if ((cmCompiledGeneratorExpression *)local_148._0_8_ !=
        (cmCompiledGeneratorExpression *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.Backtrace.Context.Name._M_dataplus._M_p !=
        &local_1b0.Backtrace.Context.Name.field_2) {
      operator_delete(local_1b0.Backtrace.Context.Name._M_dataplus._M_p,
                      local_1b0.Backtrace.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,(ulong)((long)&local_d8[0]->_vptr_cmGeneratorExpressionEvaluator + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,(ulong)((long)&local_98[0]->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return sVar4 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                bool implib, std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(implib);
  const char* propertyName = 0;
  std::string propertyNameStr = targetTypeName;
  if(!propertyNameStr.empty())
    {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
    }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = 0;
  std::string configPropStr = targetTypeName;
  if(!configPropStr.empty())
    {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
    }

  // Select an output directory.
  if(const char* config_outdir = this->GetProperty(configProp))
    {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf = "";
    }
  else if(const char* outdir = this->GetProperty(propertyName))
    {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir)
      {
      conf = "";
      }
    }
  else if(this->GetType() == cmState::EXECUTABLE)
    {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  else if(this->GetType() == cmState::STATIC_LIBRARY ||
          this->GetType() == cmState::SHARED_LIBRARY ||
          this->GetType() == cmState::MODULE_LIBRARY)
    {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
    }
  if(out.empty())
    {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
    }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath
         (out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if(!conf.empty())
    {
    bool iosPlatform = this->Makefile->PlatformIsAppleIos();
    std::string suffix =
      usesDefaultOutputDir && iosPlatform ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->
      AppendDirectoryForConfig("/", conf, suffix, out);
    }

  return usesDefaultOutputDir;
}